

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

string * __thiscall filesystem::path::str_abi_cxx11_(path *this,path_type type)

{
  long lVar1;
  size_type sVar2;
  const_reference pvVar3;
  int in_EDX;
  int *in_RSI;
  string *in_RDI;
  size_t i_1;
  size_t i;
  size_t length;
  ostringstream oss;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ostringstream local_190 [380];
  int local_14;
  
  local_14 = in_EDX;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((*(byte *)(in_RSI + 8) & 1) != 0) {
    if (*in_RSI == 1) {
      std::operator<<((ostream *)local_190,"/");
    }
    else {
      local_1a8 = 0;
      for (local_1b0 = 0;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(in_RSI + 2)), local_1b0 < sVar2; local_1b0 = local_1b0 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 2),local_1b0);
        lVar1 = std::__cxx11::string::length();
        local_1a8 = lVar1 + 1 + local_1a8;
      }
      if ((*(byte *)((long)in_RSI + 0x21) & 1) != 0) {
        local_1a8 = local_1a8 + 2;
      }
      if (local_1a8 < 0x105) {
        if ((*(byte *)((long)in_RSI + 0x21) & 1) != 0) {
          std::operator<<((ostream *)local_190,"\\\\");
        }
      }
      else if ((*(byte *)((long)in_RSI + 0x21) & 1) == 0) {
        std::operator<<((ostream *)local_190,"\\\\?\\");
      }
      else {
        std::operator<<((ostream *)local_190,"\\\\?\\UNC\\");
      }
    }
  }
  for (local_1b8 = 0;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RSI + 2)), local_1b8 < sVar2; local_1b8 = local_1b8 + 1) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)(in_RSI + 2),local_1b8);
    std::operator<<((ostream *)local_190,(string *)pvVar3);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 2));
    if (local_1b8 + 1 < sVar2) {
      if (local_14 == 1) {
        std::operator<<((ostream *)local_190,'/');
      }
      else {
        std::operator<<((ostream *)local_190,'\\');
      }
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string str(path_type type = native_path) const {
        std::ostringstream oss;

        if (m_absolute) {
            if (m_type == posix_path)
                oss << "/";
            else {
                size_t length = 0;
                for (size_t i = 0; i < m_path.size(); ++i)
                    // No special case for the last segment to count the NULL character
                    length += m_path[i].length() + 1;
                if (m_smb)
                    length += 2;

                // Windows requires a \\?\ prefix to handle paths longer than MAX_PATH
                // (including their null character). NOTE: relative paths >MAX_PATH are
                // not supported at all in Windows.
                if (length > MAX_PATH_WINDOWS_LEGACY) {
                    if (m_smb)
                        oss << "\\\\?\\UNC\\";
                    else
                        oss << "\\\\?\\";
                } else if (m_smb)
                    oss << "\\\\";
            }
        }

        for (size_t i=0; i<m_path.size(); ++i) {
            oss << m_path[i];
            if (i+1 < m_path.size()) {
                if (type == posix_path)
                    oss << '/';
                else
                    oss << '\\';
            }
        }

        return oss.str();
    }